

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<capnproto_test::capnp::test::TestCallOrder::Client> * __thiscall
kj::_::NullableValue<capnproto_test::capnp::test::TestCallOrder::Client>::operator=
          (NullableValue<capnproto_test::capnp::test::TestCallOrder::Client> *this,
          NullableValue<capnproto_test::capnp::test::TestCallOrder::Client> *other)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  undefined8 uVar3;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      Own<capnp::ClientHook,_std::nullptr_t>::dispose
                ((Own<capnp::ClientHook,_std::nullptr_t> *)((long)&this->field_1 + 8));
    }
    if (other->isSet == true) {
      p_Var2 = (other->field_1).value._vptr_Client[-3];
      p_Var1 = (_func_int *)((long)&other->field_1 + (long)p_Var2);
      uVar3 = *(undefined8 *)(p_Var1 + 8);
      *(undefined8 *)((long)&this->field_1 + 8) = *(undefined8 *)p_Var1;
      *(undefined8 *)((long)&this->field_1 + 0x10) = uVar3;
      *(undefined8 *)((long)&other->field_1 + (long)(p_Var2 + 8)) = 0;
      (this->field_1).value._vptr_Client =
           (_func_int **)&capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }